

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s-hierarchy-trainer.cc
# Opt level: O1

void ReadSentencePair(string *line,vector<int,_std::allocator<int>_> *s,Dict *sd,
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     *c,Dict *cd,
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     *l,Dict *ld,int *unk,int *total)

{
  byte bVar1;
  iterator iVar2;
  pointer pvVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  byte bVar9;
  vector<int,_std::allocator<int>_> ctmp;
  string sep;
  int k;
  istringstream in;
  string local_250;
  int local_22c;
  vector<int,_std::allocator<int>_> local_228;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_210;
  Dict *local_208;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_200;
  long local_1f8;
  undefined1 *local_1f0;
  size_t local_1e8;
  undefined1 local_1e0 [16];
  string local_1d0;
  long local_1b0 [4];
  byte abStack_190 [88];
  ios_base local_138 [264];
  
  local_210 = l;
  local_208 = sd;
  local_200 = c;
  std::__cxx11::istringstream::istringstream((istringstream *)local_1b0,(string *)line,_S_in);
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  local_250._M_string_length = 0;
  local_250.field_2._M_local_buf[0] = '\0';
  local_1f0 = local_1e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"|||","");
  if ((abStack_190[*(long *)(local_1b0[0] + -0x18)] & 5) == 0) {
    lVar8 = 0;
    do {
      local_1f8 = lVar8 * 3;
      while( true ) {
        std::operator>>((istream *)local_1b0,(string *)&local_250);
        if ((abStack_190[*(long *)(local_1b0[0] + -0x18)] & 5) != 0) goto LAB_00162564;
        if ((local_250._M_string_length == local_1e8) &&
           ((local_250._M_string_length == 0 ||
            (iVar5 = bcmp(local_250._M_dataplus._M_p,local_1f0,local_250._M_string_length),
            iVar5 == 0)))) break;
        if ((int)lVar8 == 1) {
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::resize(local_210,
                   (long)(s->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(s->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start >> 2);
LAB_0016278a:
          pvVar3 = (local_210->
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          iVar5 = cnn::Dict::Convert(ld,&local_250);
          local_1d0._M_dataplus._M_p._0_4_ = iVar5;
          iVar2._M_current = *(int **)((long)pvVar3 + local_1f8 * 8 + -0x10);
          if (iVar2._M_current == *(int **)((long)pvVar3 + local_1f8 * 8 + -8)) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      ((vector<int,_std::allocator<int>_> *)
                       ((long)&pvVar3[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data + local_1f8 * 8),iVar2,(int *)&local_1d0);
          }
          else {
            *iVar2._M_current = iVar5;
            *(int **)((long)pvVar3 + local_1f8 * 8 + -0x10) = iVar2._M_current + 1;
          }
        }
        else {
          if ((int)lVar8 != 0) goto LAB_0016278a;
          *total = *total + 1;
          local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (int *)0x0;
          local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (int *)0x0;
          if (local_250._M_string_length != 0) {
            uVar7 = 1;
            do {
              local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
              std::__cxx11::string::_M_construct((ulong)&local_1d0,'\x01');
              local_22c = cnn::Dict::Convert(cd,&local_1d0);
              if (local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (&local_228,
                           (iterator)
                           local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,&local_22c);
              }
              else {
                *local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish = local_22c;
                local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
                operator_delete(local_1d0._M_dataplus._M_p);
              }
              bVar4 = uVar7 < local_250._M_string_length;
              uVar7 = (ulong)((int)uVar7 + 1);
            } while (bVar4);
          }
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::push_back(local_200,&local_228);
          if (local_250._M_string_length != 0) {
            uVar6 = 1;
            uVar7 = 0;
            do {
              bVar1 = local_250._M_dataplus._M_p[uVar7];
              bVar9 = 0x30;
              if ((byte)(bVar1 - 0x30) < 10) {
LAB_00162724:
                local_250._M_dataplus._M_p[uVar7] = bVar9;
              }
              else if ((byte)(bVar1 + 0xbf) < 0x1a) {
                bVar9 = bVar1 | 0x20;
                goto LAB_00162724;
              }
              uVar7 = (ulong)uVar6;
              uVar6 = uVar6 + 1;
            } while (uVar7 < local_250._M_string_length);
          }
          iVar5 = cnn::Dict::Convert(local_208,&local_250);
          local_1d0._M_dataplus._M_p._0_4_ = iVar5;
          if (iVar5 == kUNK) {
            *unk = *unk + 1;
          }
          iVar2._M_current =
               (s->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_finish;
          if (iVar2._M_current ==
              (s->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)s,iVar2,(int *)&local_1d0);
          }
          else {
            *iVar2._M_current = iVar5;
            (s->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish = iVar2._M_current + 1;
          }
          if (local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
        }
        if ((abStack_190[*(long *)(local_1b0[0] + -0x18)] & 5) != 0) goto LAB_00162564;
      }
      lVar8 = lVar8 + 1;
    } while ((abStack_190[*(long *)(local_1b0[0] + -0x18)] & 5) == 0);
  }
LAB_00162564:
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void ReadSentencePair(const string& line, vector<int>* s, cnn::Dict* sd, vector< vector<int> >* c, cnn::Dict* cd, vector< vector<int> >& l, cnn::Dict* ld, int& unk, int& total){
  istringstream in(line);
  string word;
  string sep = "|||";
  int f = 0;

  while(in) {
    in >> word;
    if (!in) break;

    if (word == sep) { f+=1; continue; }
    
    if(f == 0) {
      total += 1;
      vector<int> ctmp;
      for(unsigned i = 0; i < word.size(); i ++){
        ctmp.push_back(cd->Convert(string(1,word[i])));
      }
      c->push_back(ctmp);
      normalize_digital_lower(word);
      int k = sd->Convert(word);
      if(k == kUNK) unk++;
      s->push_back(k);
    }
    else {
      if(f == 1) l.resize(s->size());
      l[f-1].push_back(ld->Convert(word));
    }
  }
}